

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O1

pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* Path::protocol_split
            (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *__return_storage_ptr__,string *path)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  long lVar3;
  char *__end;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  _Alloc_hider local_48;
  size_type local_40;
  size_type local_38;
  undefined8 uStack_30;
  
  if (path->_M_string_length == 0) {
    paVar2 = &local_68.field_2;
    local_68._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"","");
    local_48._M_p = (pointer)&local_38;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"","");
    paVar1 = &(__return_storage_ptr__->first).field_2;
    (__return_storage_ptr__->first)._M_dataplus._M_p = (pointer)paVar1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p == paVar2) {
      paVar1->_M_allocated_capacity =
           CONCAT71(local_68.field_2._M_allocated_capacity._1_7_,local_68.field_2._M_local_buf[0]);
      *(undefined8 *)((long)&(__return_storage_ptr__->first).field_2 + 8) = local_68.field_2._8_8_;
    }
    else {
      (__return_storage_ptr__->first)._M_dataplus._M_p = local_68._M_dataplus._M_p;
      (__return_storage_ptr__->first).field_2._M_allocated_capacity =
           CONCAT71(local_68.field_2._M_allocated_capacity._1_7_,local_68.field_2._M_local_buf[0]);
    }
    (__return_storage_ptr__->first)._M_string_length = local_68._M_string_length;
    local_68._M_string_length = 0;
    local_68.field_2._M_local_buf[0] = '\0';
    paVar1 = &(__return_storage_ptr__->second).field_2;
    (__return_storage_ptr__->second)._M_dataplus._M_p = (pointer)paVar1;
    if ((size_type *)local_48._M_p == &local_38) {
      paVar1->_M_allocated_capacity = local_38;
      *(undefined8 *)((long)&(__return_storage_ptr__->second).field_2 + 8) = uStack_30;
    }
    else {
      (__return_storage_ptr__->second)._M_dataplus._M_p = local_48._M_p;
      (__return_storage_ptr__->second).field_2._M_allocated_capacity = local_38;
    }
    (__return_storage_ptr__->second)._M_string_length = local_40;
    local_68._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    lVar3 = std::__cxx11::string::find((char *)path,0x323b12,0);
    if (lVar3 != -1) {
      std::__cxx11::string::substr((ulong)&local_68,(ulong)path);
      std::__cxx11::string::substr((ulong)&local_48,(ulong)path);
      paVar1 = &(__return_storage_ptr__->first).field_2;
      (__return_storage_ptr__->first)._M_dataplus._M_p = (pointer)paVar1;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p == &local_68.field_2) {
        paVar1->_M_allocated_capacity =
             CONCAT71(local_68.field_2._M_allocated_capacity._1_7_,local_68.field_2._M_local_buf[0])
        ;
        *(undefined8 *)((long)&(__return_storage_ptr__->first).field_2 + 8) = local_68.field_2._8_8_
        ;
      }
      else {
        (__return_storage_ptr__->first)._M_dataplus._M_p = local_68._M_dataplus._M_p;
        (__return_storage_ptr__->first).field_2._M_allocated_capacity =
             CONCAT71(local_68.field_2._M_allocated_capacity._1_7_,local_68.field_2._M_local_buf[0])
        ;
      }
      (__return_storage_ptr__->first)._M_string_length = local_68._M_string_length;
      paVar1 = &(__return_storage_ptr__->second).field_2;
      (__return_storage_ptr__->second)._M_dataplus._M_p = (pointer)paVar1;
      if ((size_type *)local_48._M_p == &local_38) {
        paVar1->_M_allocated_capacity = local_38;
        *(undefined8 *)((long)&(__return_storage_ptr__->second).field_2 + 8) = uStack_30;
      }
      else {
        (__return_storage_ptr__->second)._M_dataplus._M_p = local_48._M_p;
        (__return_storage_ptr__->second).field_2._M_allocated_capacity = local_38;
      }
      (__return_storage_ptr__->second)._M_string_length = local_40;
      return __return_storage_ptr__;
    }
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"");
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              (__return_storage_ptr__,&local_68,path);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,
                    CONCAT71(local_68.field_2._M_allocated_capacity._1_7_,
                             local_68.field_2._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

pair<string, string> protocol_split(const string &path)
{
	if (path.empty())
		return make_pair(string(""), string(""));

	auto index = path.find("://");
	if (index == string::npos)
		return make_pair(string(""), path);

	return make_pair(path.substr(0, index), path.substr(index + 3, string::npos));
}